

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  string *__rhs;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer __lhs;
  string local_70;
  string local_50;
  
  pbVar1 = (this->OD->OriginalDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __rhs = &this->Directory;
  bVar2 = true;
  for (__lhs = (this->OD->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar1; __lhs = __lhs + 1) {
    bVar3 = std::operator!=(__lhs,__rhs);
    if (bVar3) {
      cmsys::SystemTools::GetRealPath(&local_50,__lhs,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&local_70,__rhs,(string *)0x0);
      bVar3 = std::operator!=(&local_50,&local_70);
      if (bVar3) {
        iVar4 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,__lhs);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if ((char)iVar4 != '\0') {
          if (bVar2) {
            std::operator<<((ostream *)w,"  ");
            (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,w);
            poVar5 = std::operator<<((ostream *)w," in ");
            poVar5 = std::operator<<(poVar5,(string *)__rhs);
            std::operator<<(poVar5," may be hidden by files in:\n");
          }
          poVar5 = std::operator<<((ostream *)w,"    ");
          poVar5 = std::operator<<(poVar5,(string *)__lhs);
          std::operator<<(poVar5,"\n");
          bVar2 = false;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (std::string const& dir : this->OD->OriginalDirectories) {
      // Check if this directory conflicts with the entry.
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }